

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O0

void ecatthread(void *ptr)

{
  int iVar1;
  long lVar2;
  int64 cycletime;
  int pcounter;
  int i;
  int ht;
  int rc;
  timeval tp;
  timespec ts;
  void *ptr_local;
  
  cycletime._0_4_ = 0;
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  gettimeofday((timeval *)&ht,(__timezone_ptr_t)0x0);
  tp.tv_usec = _ht;
  iVar1 = *ptr;
  toff = 0;
  dorun = 0;
  do {
    do {
      add_timespec((timespec *)&tp.tv_usec,iVar1 * 1000 + toff);
      pthread_cond_timedwait
                ((pthread_cond_t *)&cond,(pthread_mutex_t *)&mutex,(timespec *)&tp.tv_usec);
    } while (dorun < 1);
    gettimeofday((timeval *)&ht,(__timezone_ptr_t)0x0);
    ec_send_processdata();
    ec_receive_processdata(2000);
    cyclecount = cyclecount + 1;
    if ((in_EBOX->counter != (uint)cycletime) && (streampos < 199999)) {
      if ((uint)cycletime + 1 < (uint)in_EBOX->counter) {
        for (cycletime._4_4_ = 0; cycletime._4_4_ < 0x32; cycletime._4_4_ = cycletime._4_4_ + 1) {
          stream1[streampos] = 20000;
          lVar2 = (long)streampos;
          streampos = streampos + 1;
          stream2[lVar2] = -20000;
        }
      }
      else {
        for (cycletime._4_4_ = 0; cycletime._4_4_ < 0x32; cycletime._4_4_ = cycletime._4_4_ + 1) {
          stream1[streampos] = in_EBOX->stream[cycletime._4_4_ << 1];
          lVar2 = (long)streampos;
          streampos = streampos + 1;
          stream2[lVar2] = in_EBOX->stream[cycletime._4_4_ * 2 + 1];
        }
      }
      cycletime._0_4_ = (uint)in_EBOX->counter;
    }
    ec_sync(_ec_DCtime,(long)(iVar1 * 1000),&toff);
  } while( true );
}

Assistant:

void ecatthread( void *ptr )
{
   struct timespec   ts;
   struct timeval    tp;
   int rc;
   int ht;
   int i;
   int pcounter = 0;
   int64 cycletime;
   
   rc = pthread_mutex_lock(&mutex);
   rc =  gettimeofday(&tp, NULL);

    /* Convert from timeval to timespec */
   ts.tv_sec  = tp.tv_sec;
   ht = (tp.tv_usec / 1000) + 1; /* round to nearest ms */
   ts.tv_nsec = ht * 1000000;
   cycletime = *(int*)ptr * 1000; /* cycletime in ns */
   toff = 0;
   dorun = 0;
   while(1)
   {   
      /* calculate next cycle start */
      add_timespec(&ts, cycletime + toff);
      /* wait to cycle start */
      rc = pthread_cond_timedwait(&cond, &mutex, &ts);
      if (dorun>0)
      {
         rc =  gettimeofday(&tp, NULL);

         ec_send_processdata();

         ec_receive_processdata(EC_TIMEOUTRET);

         cyclecount++;

         
         if((in_EBOX->counter != pcounter) && (streampos < (MAXSTREAM - 1)))
         {
            // check if we have timing problems in master
            // if so, overwrite stream data so it shows up clearly in plots.
            if(in_EBOX->counter > (pcounter + 1))
            {
               for(i = 0 ; i < 50 ; i++)
               {
                  stream1[streampos]   = 20000;
                  stream2[streampos++] = -20000;
               }
            }
            else
            {
               for(i = 0 ; i < 50 ; i++)
               {
                  stream1[streampos]   = in_EBOX->stream[i * 2];
                  stream2[streampos++] = in_EBOX->stream[(i * 2) + 1];
               }
            }
            pcounter = in_EBOX->counter;
         }
                      
         /* calulate toff to get linux time and DC synced */
         ec_sync(ec_DCtime, cycletime, &toff);
      }   
   }    
}